

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> * __thiscall
libtorrent::bt_peer_connection::hit_send_barrier
          (tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *__return_storage_ptr__,
          bt_peer_connection *this,span<libtorrent::span<char>_> iovec)

{
  _List_node_base *local_40;
  _List_node_base *local_38;
  uint local_30;
  
  encryption_handler::encrypt
            ((encryption_handler *)&local_40,(char *)&this->m_enc_handler,(int)iovec.m_ptr);
  if (local_30 != 0) {
    peer_connection::peer_log
              (&this->super_peer_connection,outgoing,"SEND_BARRIER","encrypted block s = %d",
               (ulong)local_30);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_int,_libtorrent::span<libtorrent::span<const_char>_>_>).
  super__Tuple_impl<1UL,_libtorrent::span<libtorrent::span<const_char>_>_>.
  super__Head_base<1UL,_libtorrent::span<libtorrent::span<const_char>_>,_false>._M_head_impl.m_ptr =
       (span<const_char> *)local_40;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_int,_libtorrent::span<libtorrent::span<const_char>_>_>).
  super__Tuple_impl<1UL,_libtorrent::span<libtorrent::span<const_char>_>_>.
  super__Head_base<1UL,_libtorrent::span<libtorrent::span<const_char>_>,_false>._M_head_impl.m_len =
       (difference_type)local_38;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_int,_libtorrent::span<libtorrent::span<const_char>_>_>).
  super__Head_base<0UL,_int,_false>._M_head_impl = local_30;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int, span<span<char const>>>
	bt_peer_connection::hit_send_barrier(
		span<span<char>> iovec)
	{
		int next_barrier;
		span<span<char const>> out_iovec;
		std::tie(next_barrier, out_iovec) = m_enc_handler.encrypt(iovec);
#ifndef TORRENT_DISABLE_LOGGING
		if (next_barrier != 0)
			peer_log(peer_log_alert::outgoing, "SEND_BARRIER"
				, "encrypted block s = %d", next_barrier);
#endif
		return std::make_tuple(next_barrier, out_iovec);
	}